

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

int __thiscall gdsForge::GDSwriteBitArr(gdsForge *this,int record,bitset<16UL> inBits)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  reference local_58;
  int local_44;
  undefined1 local_40 [4];
  int i_1;
  int local_30;
  byte local_2a;
  byte local_29;
  int i;
  int iStack_24;
  uchar dataOut [2];
  uchar OHout [4];
  int record_local;
  gdsForge *this_local;
  bitset<16UL> inBits_local;
  
  iStack_24 = record;
  this_local = (gdsForge *)inBits.super__Base_bitset<1UL>._M_w;
  if ((record & 0xffU) == 1) {
    i._0_1_ = 0;
    i._1_1_ = 6;
    i._2_1_ = (undefined1)((uint)record >> 8);
    i._3_1_ = (undefined1)record;
    fwrite(&i,1,4,(FILE *)this->gdsFile);
    memset(&local_2a,0,2);
    for (local_30 = 0xf; bVar1 = local_2a, 7 < local_30; local_30 = local_30 + -1) {
      std::bitset<16UL>::operator[]((bitset<16UL> *)local_40,(size_t)&this_local);
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)local_40);
      local_2a = bVar1 | bVar2 << ((char)local_30 - 8U & 0x1f);
      std::bitset<16UL>::reference::~reference((reference *)local_40);
    }
    for (local_44 = 8; bVar1 = local_29, 0 < local_44; local_44 = local_44 + -1) {
      std::bitset<16UL>::operator[]((bitset<16UL> *)&local_58,(size_t)&this_local);
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_58);
      local_29 = bVar1 | bVar2 << ((byte)local_44 & 0x1f);
      std::bitset<16UL>::reference::~reference(&local_58);
    }
    fwrite(&local_2a,1,2,(FILE *)this->gdsFile);
    inBits_local.super__Base_bitset<1UL>._M_w._4_4_ = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Incorrect record: 0x");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iStack_24);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::dec);
    inBits_local.super__Base_bitset<1UL>._M_w._4_4_ = 1;
  }
  return inBits_local.super__Base_bitset<1UL>._M_w._4_4_;
}

Assistant:

int gdsForge::GDSwriteBitArr(int record, bitset<16> inBits)
{
  if ((record & 0xff) != 0x01) {
    cout << "Incorrect record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }
  unsigned char OHout[4];

  OHout[0] = 0 & 0xff;
  OHout[1] = (2 + 4) & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[2] = {0, 0};

  for (int i = 15; i >= 8; i--) {
    dataOut[0] = dataOut[0] | (inBits[i] << (i - 8));
  }
  for (int i = 8; i > 0; i--) {
    dataOut[1] = dataOut[1] | (inBits[i] << i);
  }

  fwrite(dataOut, 1, 2, this->gdsFile);

  return 0;
}